

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryBefore(Normalizer2Impl *this,uint8_t *src,uint8_t *limit)

{
  byte bVar1;
  byte t3;
  UBool UVar2;
  int iVar3;
  uint lt1;
  byte *pbVar4;
  uint local_44;
  uint local_30;
  uint8_t __t3;
  uint8_t __t2;
  uint8_t __t1;
  int32_t __lead;
  uint16_t norm16;
  uint8_t *limit_local;
  uint8_t *src_local;
  Normalizer2Impl *this_local;
  
  if (src == limit) {
    return '\x01';
  }
  pbVar4 = src + 1;
  local_30 = (uint)*src;
  if ((*src & 0x80) != 0) {
    if (pbVar4 != limit) {
      if (local_30 < 0xe0) {
        if ((0xc1 < local_30) && ((byte)(*pbVar4 + 0x80) < 0x40)) {
          local_30 = (uint)this->normTrie->index[(int)(local_30 & 0x1f)] +
                     (uint)(byte)(*pbVar4 + 0x80);
          goto LAB_00354cf8;
        }
      }
      else if (local_30 < 0xf0) {
        if (((((int)" 000000000000\x1000"[(int)(local_30 & 0xf)] &
              1 << (sbyte)((int)(uint)*pbVar4 >> 5)) != 0) && (src + 2 != limit)) &&
           (bVar1 = src[2] + 0x80, bVar1 < 0x40)) {
          local_30 = (uint)this->normTrie->index[(int)((local_30 & 0xf) * 0x40 + (*pbVar4 & 0x3f))]
                     + (uint)bVar1;
          goto LAB_00354cf8;
        }
      }
      else {
        iVar3 = local_30 - 0xf0;
        if ((iVar3 < 5) && (((int)""[(int)(uint)*pbVar4 >> 4] & 1 << ((byte)iVar3 & 0x1f)) != 0)) {
          lt1 = iVar3 * 0x40 | *pbVar4 & 0x3f;
          if ((src + 2 != limit) &&
             (((bVar1 = src[2] + 0x80, bVar1 < 0x40 && (src + 3 != limit)) &&
              (t3 = src[3] + 0x80, t3 < 0x40)))) {
            if ((int)lt1 < (int)(uint)this->normTrie->shifted12HighStart) {
              local_44 = ucptrie_internalSmallU8Index_63(this->normTrie,lt1,bVar1,t3);
            }
            else {
              local_44 = this->normTrie->dataLength - 2;
            }
            local_30 = local_44;
            goto LAB_00354cf8;
          }
        }
      }
    }
    local_30 = this->normTrie->dataLength - 1;
  }
LAB_00354cf8:
  UVar2 = norm16HasCompBoundaryBefore
                    (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)(int)local_30 * 2)
                    );
  return UVar2;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryBefore(const uint8_t *src, const uint8_t *limit) const {
    if (src == limit) {
        return TRUE;
    }
    uint16_t norm16;
    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
    return norm16HasCompBoundaryBefore(norm16);
}